

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
::equal(subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
        *this,subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
              *that)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  bool bVar7;
  
  if ((this->m_begin).m_value != (that->m_begin).m_value) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x81,
                  "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
                 );
  }
  if ((this->m_end).m_value == (that->m_end).m_value) {
    lVar3 = this->m_subset_size;
    if (lVar3 == that->m_subset_size) {
      if (lVar3 == 0) {
        return lVar3 == 0;
      }
      piVar4 = (this->m_subset).
               super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = (that->m_subset).
               super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (piVar4->m_value == piVar5->m_value) {
        lVar6 = 4;
        do {
          bVar7 = lVar3 << 2 == lVar6;
          if (bVar7) {
            return bVar7;
          }
          piVar1 = (int *)((long)&piVar4->m_value + lVar6);
          piVar2 = (int *)((long)&piVar5->m_value + lVar6);
          lVar6 = lVar6 + 4;
        } while (*piVar1 == *piVar2);
      }
    }
    return false;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x82,
                "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
               );
}

Assistant:

bool equal (const subset_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subset_begin(), this->subset_end(),
                    that.subset_begin(), that.subset_end()
                );
        }